

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

uint __thiscall
ImGui::RoundScalarWithFormatT<unsigned_int,int>
          (ImGui *this,char *format,ImGuiDataType data_type,uint v)

{
  char *pcVar1;
  ImGui IVar2;
  undefined4 in_register_0000000c;
  ImGui *pIVar3;
  ImGui *pIVar4;
  size_t fmt_out_size;
  char *src;
  double dVar5;
  char v_str [64];
  char fmt_sanitized [32];
  undefined4 local_7c;
  char local_78 [64];
  char local_38 [40];
  
  pIVar3 = (ImGui *)CONCAT44(in_register_0000000c,v);
  do {
    IVar2 = *this;
    if (IVar2 == (ImGui)0x0) {
      fmt_out_size = 3;
      pIVar4 = pIVar3;
    }
    else if ((IVar2 != (ImGui)0x25) || (fmt_out_size = 1, pIVar4 = this, this[1] == (ImGui)0x25)) {
      this = this + (ulong)(IVar2 == (ImGui)0x25) + 1;
      fmt_out_size = 0;
      pIVar4 = pIVar3;
    }
    pIVar3 = pIVar4;
  } while ((int)fmt_out_size == 0);
  if ((int)fmt_out_size == 1) {
    this = pIVar4;
  }
  if ((*this == (ImGui)0x25) && (this[1] != (ImGui)0x25)) {
    local_7c = data_type;
    SanitizeFormatString((char *)this,local_38,fmt_out_size);
    ImFormatString(local_78,0x40,local_38,(ulong)local_7c);
    src = (char *)((long)&local_7c + 3);
    do {
      pcVar1 = src + 1;
      src = src + 1;
    } while (*pcVar1 == ' ');
    if (((uint)format & 0xfffffffe) == 8) {
      dVar5 = atof(src);
      data_type = (ImGuiDataType)(long)dVar5;
    }
    else {
      ImAtoi<int>(src,&local_7c);
      data_type = local_7c;
    }
  }
  return data_type;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}